

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_handle_iCCP(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  ushort uVar1;
  ushort uVar2;
  uLong adler;
  bool bVar3;
  int iVar4;
  uint profile_length_00;
  int iVar5;
  png_bytep profile_00;
  png_charp pcVar6;
  bool bVar7;
  png_bytep profile;
  png_uint_32 tag_count;
  png_uint_32 profile_length;
  png_alloc_size_t size;
  Byte local_buffer [1024];
  Byte profile_header [132];
  undefined1 local_88 [8];
  char keyword [81];
  uInt keyword_length;
  uInt read_length;
  int finished;
  png_const_charp errmsg;
  png_inforp ppStack_18;
  png_uint_32 length_local;
  png_inforp info_ptr_local;
  png_structrp png_ptr_local;
  
  _read_length = (char *)0x0;
  bVar3 = false;
  errmsg._4_4_ = length;
  ppStack_18 = info_ptr;
  info_ptr_local = (png_inforp)png_ptr;
  if ((png_ptr->mode & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  if ((png_ptr->mode & 6) == 0) {
    if (length < 0xe) {
      png_crc_finish(png_ptr,length);
      png_chunk_benign_error((png_const_structrp)info_ptr_local,"too short");
    }
    else if (((png_ptr->colorspace).flags & 0x8000) == 0) {
      if (((png_ptr->colorspace).flags & 4) == 0) {
        stack0xffffffffffffffd0 = 0x51;
        if (length < 0x51) {
          unique0x100008fc = length;
        }
        png_crc_read(png_ptr,local_88,stack0xffffffffffffffd0);
        errmsg._4_4_ = errmsg._4_4_ - stack0xffffffffffffffd0;
        if (errmsg._4_4_ < 0xb) {
          png_crc_finish((png_structrp)info_ptr_local,errmsg._4_4_);
          png_chunk_benign_error((png_const_structrp)info_ptr_local,"too short");
          return;
        }
        keyword[0x4c] = '\0';
        keyword[0x4d] = '\0';
        keyword[0x4e] = '\0';
        keyword[0x4f] = '\0';
        while( true ) {
          bVar7 = false;
          if (((uint)keyword._76_4_ < 0x50) &&
             (bVar7 = false, (uint)keyword._76_4_ < stack0xffffffffffffffd0)) {
            bVar7 = local_88[(uint)keyword._76_4_] != '\0';
          }
          if (!bVar7) break;
          keyword._76_4_ = keyword._76_4_ + 1;
        }
        if ((keyword._76_4_ == 0) || (0x4f < (uint)keyword._76_4_)) {
          _read_length = "bad keyword";
        }
        else if ((keyword._76_4_ + 1 < stack0xffffffffffffffd0) &&
                (local_88[keyword._76_4_ + 1] == '\0')) {
          register0x00000000 = stack0xffffffffffffffd0 - (keyword._76_4_ + 2);
          iVar4 = png_inflate_claim((png_structrp)info_ptr_local,0x69434350);
          if (iVar4 == 0) {
            memset(local_buffer + 0x3f8,0,0x84);
            _tag_count = 0x84;
            info_ptr_local->splt_palettes = (png_sPLT_tp)(local_88 + (keyword._76_4_ + 2));
            info_ptr_local->splt_palettes_num = stack0xffffffffffffffd0;
            png_inflate_read((png_structrp)info_ptr_local,(png_bytep)&size,0x400,
                             (png_uint_32p)((long)&errmsg + 4),local_buffer + 0x3f8,
                             (png_alloc_size_t *)&tag_count,0);
            if (_tag_count == 0) {
              profile_length_00 =
                   (uint)local_buffer[0x3f8] * 0x1000000 + (uint)local_buffer[0x3f9] * 0x10000 +
                   (uint)local_buffer[0x3fa] * 0x100 + (uint)local_buffer[0x3fb];
              iVar4 = png_icc_check_length
                                ((png_const_structrp)info_ptr_local,
                                 (png_colorspacerp)
                                 &info_ptr_local[3].colorspace.end_points_XYZ.green_Y,local_88,
                                 profile_length_00);
              if ((iVar4 != 0) &&
                 (iVar4 = png_icc_check_header
                                    ((png_const_structrp)info_ptr_local,
                                     (png_colorspacerp)
                                     &info_ptr_local[3].colorspace.end_points_XYZ.green_Y,local_88,
                                     profile_length_00,local_buffer + 0x3f8,
                                     (uint)*(byte *)((long)&info_ptr_local[1].hist + 7)), iVar4 != 0
                 )) {
                iVar4 = (uint)profile_header[0x78] * 0x1000000 +
                        (uint)profile_header[0x79] * 0x10000 + (uint)profile_header[0x7a] * 0x100 +
                        (uint)profile_header[0x7b];
                profile_00 = png_read_buffer((png_structrp)info_ptr_local,(ulong)profile_length_00,2
                                            );
                if (profile_00 == (png_bytep)0x0) {
                  _read_length = "out of memory";
                }
                else {
                  memcpy(profile_00,local_buffer + 0x3f8,0x84);
                  _tag_count = (ulong)(uint)(iVar4 * 0xc);
                  png_inflate_read((png_structrp)info_ptr_local,(png_bytep)&size,0x400,
                                   (png_uint_32p)((long)&errmsg + 4),profile_00 + 0x84,
                                   (png_alloc_size_t *)&tag_count,0);
                  if (_tag_count == 0) {
                    iVar5 = png_icc_check_tag_table
                                      ((png_const_structrp)info_ptr_local,
                                       (png_colorspacerp)
                                       &info_ptr_local[3].colorspace.end_points_XYZ.green_Y,local_88
                                       ,profile_length_00,profile_00);
                    if (iVar5 != 0) {
                      _tag_count = ((ulong)profile_length_00 - 0x84) - (ulong)(uint)(iVar4 * 0xc);
                      png_inflate_read((png_structrp)info_ptr_local,(png_bytep)&size,0x400,
                                       (png_uint_32p)((long)&errmsg + 4),
                                       profile_00 + (ulong)(uint)(iVar4 * 0xc) + 0x84,
                                       (png_alloc_size_t *)&tag_count,1);
                      if ((errmsg._4_4_ == 0) ||
                         (((ulong)info_ptr_local->unknown_chunks & 0x100000) != 0)) {
                        if (_tag_count == 0) {
                          if (errmsg._4_4_ != 0) {
                            png_chunk_warning((png_const_structrp)info_ptr_local,
                                              "extra compressed data");
                          }
                          png_crc_finish((png_structrp)info_ptr_local,errmsg._4_4_);
                          bVar3 = true;
                          adler._0_4_ = info_ptr_local[1].colorspace.end_points_xy.redx;
                          adler._4_4_ = info_ptr_local[1].colorspace.end_points_xy.redy;
                          png_icc_set_sRGB((png_const_structrp)info_ptr_local,
                                           (png_colorspacerp)
                                           &info_ptr_local[3].colorspace.end_points_XYZ.green_Y,
                                           profile_00,adler);
                          if (ppStack_18 != (png_inforp)0x0) {
                            png_free_data((png_const_structrp)info_ptr_local,ppStack_18,0x10,0);
                            pcVar6 = (png_charp)
                                     png_malloc_base((png_const_structrp)info_ptr_local,
                                                     (ulong)(keyword._76_4_ + 1));
                            ppStack_18->iccp_name = pcVar6;
                            if (ppStack_18->iccp_name == (png_charp)0x0) {
                              uVar1._0_1_ = info_ptr_local[3].sig_bit.blue;
                              uVar1._1_1_ = info_ptr_local[3].sig_bit.gray;
                              info_ptr_local[3].sig_bit.blue = (char)(uVar1 | 0x8000);
                              info_ptr_local[3].sig_bit.gray = (char)((uVar1 | 0x8000) >> 8);
                              _read_length = "out of memory";
                            }
                            else {
                              memcpy(ppStack_18->iccp_name,local_88,(ulong)(keyword._76_4_ + 1));
                              ppStack_18->iccp_proflen = profile_length_00;
                              ppStack_18->iccp_profile = profile_00;
                              info_ptr_local[3].interlace_type = '\0';
                              info_ptr_local[3].channels = '\0';
                              info_ptr_local[3].pixel_depth = '\0';
                              info_ptr_local[3].spare_byte = '\0';
                              info_ptr_local[3].signature[0] = '\0';
                              info_ptr_local[3].signature[1] = '\0';
                              info_ptr_local[3].signature[2] = '\0';
                              info_ptr_local[3].signature[3] = '\0';
                              ppStack_18->free_me = ppStack_18->free_me | 0x10;
                              ppStack_18->valid = ppStack_18->valid | 0x1000;
                            }
                          }
                          if (ppStack_18 != (png_inforp)0x0) {
                            png_colorspace_sync((png_const_structrp)info_ptr_local,ppStack_18);
                          }
                          if (_read_length == (char *)0x0) {
                            info_ptr_local->unknown_chunks_num = 0;
                            return;
                          }
                        }
                      }
                      else {
                        _read_length = "extra compressed data";
                      }
                      if (_read_length == (char *)0x0) {
                        _read_length = *(char **)&info_ptr_local[1].valid;
                      }
                    }
                  }
                  else {
                    _read_length = *(char **)&info_ptr_local[1].valid;
                  }
                }
              }
            }
            else {
              _read_length = *(char **)&info_ptr_local[1].valid;
            }
            info_ptr_local->unknown_chunks_num = 0;
          }
          else {
            _read_length = *(char **)&info_ptr_local[1].valid;
          }
        }
        else {
          _read_length = "bad compression method";
        }
      }
      else {
        _read_length = "too many profiles";
      }
      if (!bVar3) {
        png_crc_finish((png_structrp)info_ptr_local,errmsg._4_4_);
      }
      uVar2._0_1_ = info_ptr_local[3].sig_bit.blue;
      uVar2._1_1_ = info_ptr_local[3].sig_bit.gray;
      info_ptr_local[3].sig_bit.blue = (char)(uVar2 | 0x8000);
      info_ptr_local[3].sig_bit.gray = (char)((uVar2 | 0x8000) >> 8);
      png_colorspace_sync((png_const_structrp)info_ptr_local,ppStack_18);
      if (_read_length != (png_const_charp)0x0) {
        png_chunk_benign_error((png_const_structrp)info_ptr_local,_read_length);
      }
    }
    else {
      png_crc_finish(png_ptr,length);
    }
  }
  else {
    png_crc_finish(png_ptr,length);
    png_chunk_benign_error((png_const_structrp)info_ptr_local,"out of place");
  }
  return;
}

Assistant:

void /* PRIVATE */
png_handle_iCCP(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
/* Note: this does not properly handle profiles that are > 64K under DOS */
{
   png_const_charp errmsg = NULL; /* error message output, or no error */
   int finished = 0; /* crc checked */

   png_debug(1, "in png_handle_iCCP");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & (PNG_HAVE_IDAT|PNG_HAVE_PLTE)) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

   /* Consistent with all the above colorspace handling an obviously *invalid*
    * chunk is just ignored, so does not invalidate the color space.  An
    * alternative is to set the 'invalid' flags at the start of this routine
    * and only clear them in they were not set before and all the tests pass.
    */

   /* The keyword must be at least one character and there is a
    * terminator (0) byte and the compression method byte, and the
    * 'zlib' datastream is at least 11 bytes.
    */
   if (length < 14)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "too short");
      return;
   }

   /* If a colorspace error has already been output skip this chunk */
   if ((png_ptr->colorspace.flags & PNG_COLORSPACE_INVALID) != 0)
   {
      png_crc_finish(png_ptr, length);
      return;
   }

   /* Only one sRGB or iCCP chunk is allowed, use the HAVE_INTENT flag to detect
    * this.
    */
   if ((png_ptr->colorspace.flags & PNG_COLORSPACE_HAVE_INTENT) == 0)
   {
      uInt read_length, keyword_length;
      char keyword[81];

      /* Find the keyword; the keyword plus separator and compression method
       * bytes can be at most 81 characters long.
       */
      read_length = 81; /* maximum */
      if (read_length > length)
         read_length = (uInt)length;

      png_crc_read(png_ptr, (png_bytep)keyword, read_length);
      length -= read_length;

      /* The minimum 'zlib' stream is assumed to be just the 2 byte header,
       * 5 bytes minimum 'deflate' stream, and the 4 byte checksum.
       */
      if (length < 11)
      {
         png_crc_finish(png_ptr, length);
         png_chunk_benign_error(png_ptr, "too short");
         return;
      }

      keyword_length = 0;
      while (keyword_length < 80 && keyword_length < read_length &&
         keyword[keyword_length] != 0)
         ++keyword_length;

      /* TODO: make the keyword checking common */
      if (keyword_length >= 1 && keyword_length <= 79)
      {
         /* We only understand '0' compression - deflate - so if we get a
          * different value we can't safely decode the chunk.
          */
         if (keyword_length+1 < read_length &&
            keyword[keyword_length+1] == PNG_COMPRESSION_TYPE_BASE)
         {
            read_length -= keyword_length+2;

            if (png_inflate_claim(png_ptr, png_iCCP) == Z_OK)
            {
               Byte profile_header[132]={0};
               Byte local_buffer[PNG_INFLATE_BUF_SIZE];
               png_alloc_size_t size = (sizeof profile_header);

               png_ptr->zstream.next_in = (Bytef*)keyword + (keyword_length+2);
               png_ptr->zstream.avail_in = read_length;
               (void)png_inflate_read(png_ptr, local_buffer,
                   (sizeof local_buffer), &length, profile_header, &size,
                   0/*finish: don't, because the output is too small*/);

               if (size == 0)
               {
                  /* We have the ICC profile header; do the basic header checks.
                   */
                  png_uint_32 profile_length = png_get_uint_32(profile_header);

                  if (png_icc_check_length(png_ptr, &png_ptr->colorspace,
                      keyword, profile_length) != 0)
                  {
                     /* The length is apparently ok, so we can check the 132
                      * byte header.
                      */
                     if (png_icc_check_header(png_ptr, &png_ptr->colorspace,
                         keyword, profile_length, profile_header,
                         png_ptr->color_type) != 0)
                     {
                        /* Now read the tag table; a variable size buffer is
                         * needed at this point, allocate one for the whole
                         * profile.  The header check has already validated
                         * that none of this stuff will overflow.
                         */
                        png_uint_32 tag_count =
                           png_get_uint_32(profile_header + 128);
                        png_bytep profile = png_read_buffer(png_ptr,
                            profile_length, 2/*silent*/);

                        if (profile != NULL)
                        {
                           memcpy(profile, profile_header,
                               (sizeof profile_header));

                           size = 12 * tag_count;

                           (void)png_inflate_read(png_ptr, local_buffer,
                               (sizeof local_buffer), &length,
                               profile + (sizeof profile_header), &size, 0);

                           /* Still expect a buffer error because we expect
                            * there to be some tag data!
                            */
                           if (size == 0)
                           {
                              if (png_icc_check_tag_table(png_ptr,
                                  &png_ptr->colorspace, keyword, profile_length,
                                  profile) != 0)
                              {
                                 /* The profile has been validated for basic
                                  * security issues, so read the whole thing in.
                                  */
                                 size = profile_length - (sizeof profile_header)
                                     - 12 * tag_count;

                                 (void)png_inflate_read(png_ptr, local_buffer,
                                     (sizeof local_buffer), &length,
                                     profile + (sizeof profile_header) +
                                     12 * tag_count, &size, 1/*finish*/);

                                 if (length > 0 && !(png_ptr->flags &
                                     PNG_FLAG_BENIGN_ERRORS_WARN))
                                    errmsg = "extra compressed data";

                                 /* But otherwise allow extra data: */
                                 else if (size == 0)
                                 {
                                    if (length > 0)
                                    {
                                       /* This can be handled completely, so
                                        * keep going.
                                        */
                                       png_chunk_warning(png_ptr,
                                           "extra compressed data");
                                    }

                                    png_crc_finish(png_ptr, length);
                                    finished = 1;

# if defined(PNG_sRGB_SUPPORTED) && PNG_sRGB_PROFILE_CHECKS >= 0
                                    /* Check for a match against sRGB */
                                    png_icc_set_sRGB(png_ptr,
                                        &png_ptr->colorspace, profile,
                                        png_ptr->zstream.adler);
# endif

                                    /* Steal the profile for info_ptr. */
                                    if (info_ptr != NULL)
                                    {
                                       png_free_data(png_ptr, info_ptr,
                                           PNG_FREE_ICCP, 0);

                                       info_ptr->iccp_name = png_voidcast(char*,
                                           png_malloc_base(png_ptr,
                                           keyword_length+1));
                                       if (info_ptr->iccp_name != NULL)
                                       {
                                          memcpy(info_ptr->iccp_name, keyword,
                                              keyword_length+1);
                                          info_ptr->iccp_proflen =
                                              profile_length;
                                          info_ptr->iccp_profile = profile;
                                          png_ptr->read_buffer = NULL; /*steal*/
                                          info_ptr->free_me |= PNG_FREE_ICCP;
                                          info_ptr->valid |= PNG_INFO_iCCP;
                                       }

                                       else
                                       {
                                          png_ptr->colorspace.flags |=
                                             PNG_COLORSPACE_INVALID;
                                          errmsg = "out of memory";
                                       }
                                    }

                                    /* else the profile remains in the read
                                     * buffer which gets reused for subsequent
                                     * chunks.
                                     */

                                    if (info_ptr != NULL)
                                       png_colorspace_sync(png_ptr, info_ptr);

                                    if (errmsg == NULL)
                                    {
                                       png_ptr->zowner = 0;
                                       return;
                                    }
                                 }
                                 if (errmsg == NULL)
                                    errmsg = png_ptr->zstream.msg;
                              }
                              /* else png_icc_check_tag_table output an error */
                           }
                           else /* profile truncated */
                              errmsg = png_ptr->zstream.msg;
                        }

                        else
                           errmsg = "out of memory";
                     }

                     /* else png_icc_check_header output an error */
                  }

                  /* else png_icc_check_length output an error */
               }

               else /* profile truncated */
                  errmsg = png_ptr->zstream.msg;

               /* Release the stream */
               png_ptr->zowner = 0;
            }

            else /* png_inflate_claim failed */
               errmsg = png_ptr->zstream.msg;
         }

         else
            errmsg = "bad compression method"; /* or missing */
      }

      else
         errmsg = "bad keyword";
   }

   else
      errmsg = "too many profiles";

   /* Failure: the reason is in 'errmsg' */
   if (finished == 0)
      png_crc_finish(png_ptr, length);

   png_ptr->colorspace.flags |= PNG_COLORSPACE_INVALID;
   png_colorspace_sync(png_ptr, info_ptr);
   if (errmsg != NULL) /* else already output */
      png_chunk_benign_error(png_ptr, errmsg);
}